

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O1

void Ifn_NtkMatchPrintConfig(Ifn_Ntk_t *p,sat_solver *pSat)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  Ifn_Obj_t *pIVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  
  uVar1 = p->nObjs;
  uVar8 = (ulong)uVar1;
  if ((int)uVar1 < p->nPars) {
    do {
      iVar6 = p->nInps;
      lVar4 = (long)iVar6;
      iVar2 = p->nObjs;
      bVar3 = iVar6 < iVar2;
      iVar7 = (int)uVar8;
      if (iVar6 < iVar2) {
        pIVar5 = p->Nodes + lVar4;
        iVar6 = iVar2 - iVar6;
        do {
          lVar4 = lVar4 + 1;
          if (((*(uint *)pIVar5 & 7) == 6) && (uVar8 == (*(uint *)pIVar5 >> 8 & 0xff))) {
            if (bVar3) {
              putchar(0x20);
              goto LAB_0043d525;
            }
            break;
          }
          bVar3 = lVar4 < iVar2;
          pIVar5 = pIVar5 + 1;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      if ((p->nParsVIni <= iVar7) && (iVar6 = iVar7 - p->nParsVIni, iVar6 % p->nParsVNum == 0)) {
        printf(" %d=",(long)iVar6 / (long)p->nParsVNum & 0xffffffff);
      }
LAB_0043d525:
      if (((int)uVar1 < 0) || (pSat->size <= iVar7)) {
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0xda,"int sat_solver_var_value(sat_solver *, int)");
      }
      printf("%d",(ulong)(pSat->model[uVar8] == 1));
      uVar8 = uVar8 + 1;
    } while ((int)uVar8 < p->nPars);
  }
  return;
}

Assistant:

void Ifn_NtkMatchPrintConfig( Ifn_Ntk_t * p, sat_solver * pSat )
{
    int v, i;
    for ( v = p->nObjs; v < p->nPars; v++ )
    {
        for ( i = p->nInps; i < p->nObjs; i++ )
            if ( p->Nodes[i].Type == IFN_DSD_PRIME && (int)p->Nodes[i].iFirst == v )
                break;
        if ( i < p->nObjs )
            printf( " " );
        else if ( v >= p->nParsVIni && (v - p->nParsVIni) % p->nParsVNum == 0 )
            printf( " %d=", (v - p->nParsVIni) / p->nParsVNum );
        printf( "%d", sat_solver_var_value(pSat, v) );
    }
}